

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_ecmult_accumulate(secp256k1_sha256 *acc,secp256k1_scalar *x,secp256k1_scratch *scratch)

{
  size_t len;
  size_t size;
  uchar bytes [65];
  secp256k1_scalar zero;
  secp256k1_ge r;
  secp256k1_gej rj2;
  secp256k1_gej rj1;
  secp256k1_gej gj;
  secp256k1_gej infj;
  secp256k1_gej rj6;
  secp256k1_gej rj5;
  secp256k1_gej rj4;
  secp256k1_gej rj3;
  
  zero.d[2] = 0;
  zero.d[3] = 0;
  zero.d[0] = 0;
  zero.d[1] = 0;
  size = 0x41;
  gj.infinity = 0;
  gj.x.n[0] = 0x2815b16f81798;
  gj.x.n[1] = 0xdb2dce28d959f;
  gj.x.n[2] = 0xe870b07029bfc;
  gj.x.n[3] = 0xbbac55a06295c;
  gj.x.n[4] = 0x79be667ef9dc;
  gj.y.n[4] = 0x483ada7726a3;
  gj.y.n[0] = 0x7d08ffb10d4b8;
  gj.y.n[1] = 0x48a68554199c4;
  gj.y.n[2] = 0xe1108a8fd17b4;
  gj.y.n[3] = 0xc4655da4fbfc0;
  gj.z.n[0] = 1;
  gj.z.n[3] = 0;
  gj.z.n[4] = 0;
  gj.z.n[1] = 0;
  gj.z.n[2] = 0;
  secp256k1_gej_set_infinity(&infj);
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&rj1,x);
  secp256k1_ecmult(&rj2,&gj,x,&zero);
  secp256k1_ecmult(&rj3,&infj,&zero,x);
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch,&rj4,x,(secp256k1_ecmult_multi_callback *)0x0,
             (void *)0x0,0);
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch,&rj5,&zero,test_ecmult_accumulate_cb,x,1);
  secp256k1_ecmult_const(&rj6,&secp256k1_ge_const_g,x);
  secp256k1_ge_set_gej_var(&r,&rj1);
  ge_equals_gej(&r,&rj2);
  ge_equals_gej(&r,&rj3);
  ge_equals_gej(&r,&rj4);
  ge_equals_gej(&r,&rj5);
  ge_equals_gej(&r,&rj6);
  if (r.infinity == 0) {
    secp256k1_eckey_pubkey_serialize(&r,bytes,&size,0);
    if (size != 0x41) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
              ,0x161a,"test condition failed: size == 65");
      abort();
    }
    len = 0x41;
  }
  else {
    bytes[0] = '\0';
    len = 1;
  }
  secp256k1_sha256_write(acc,bytes,len);
  return;
}

Assistant:

static void test_ecmult_accumulate(secp256k1_sha256* acc, const secp256k1_scalar* x, secp256k1_scratch* scratch) {
    /* Compute x*G in 6 different ways, serialize it uncompressed, and feed it into acc. */
    secp256k1_gej rj1, rj2, rj3, rj4, rj5, rj6, gj, infj;
    secp256k1_ge r;
    const secp256k1_scalar zero = SECP256K1_SCALAR_CONST(0, 0, 0, 0, 0, 0, 0, 0);
    unsigned char bytes[65];
    size_t size = 65;
    secp256k1_gej_set_ge(&gj, &secp256k1_ge_const_g);
    secp256k1_gej_set_infinity(&infj);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &rj1, x);
    secp256k1_ecmult(&rj2, &gj, x, &zero);
    secp256k1_ecmult(&rj3, &infj, &zero, x);
    secp256k1_ecmult_multi_var(NULL, scratch, &rj4, x, NULL, NULL, 0);
    secp256k1_ecmult_multi_var(NULL, scratch, &rj5, &zero, test_ecmult_accumulate_cb, (void*)x, 1);
    secp256k1_ecmult_const(&rj6, &secp256k1_ge_const_g, x);
    secp256k1_ge_set_gej_var(&r, &rj1);
    ge_equals_gej(&r, &rj2);
    ge_equals_gej(&r, &rj3);
    ge_equals_gej(&r, &rj4);
    ge_equals_gej(&r, &rj5);
    ge_equals_gej(&r, &rj6);
    if (secp256k1_ge_is_infinity(&r)) {
        /* Store infinity as 0x00 */
        const unsigned char zerobyte[1] = {0};
        secp256k1_sha256_write(acc, zerobyte, 1);
    } else {
        /* Store other points using their uncompressed serialization. */
        secp256k1_eckey_pubkey_serialize(&r, bytes, &size, 0);
        CHECK(size == 65);
        secp256k1_sha256_write(acc, bytes, size);
    }
}